

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTCTE.cpp
# Opt level: O3

string * __thiscall
glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::
getTessellationEvaluationShaderCode_abi_cxx11_
          (string *__return_storage_ptr__,
          TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize *this,
          bool should_pass_pointsize_data,_tessellation_primitive_mode primitive_mode,
          _tessellation_shader_vertex_ordering vertex_ordering,
          _tessellation_shader_vertex_spacing vertex_spacing,bool is_point_mode_enabled)

{
  pointer pcVar1;
  ostream *poVar2;
  ulong uVar3;
  _tessellation_primitive_mode extraout_EDX;
  _tessellation_primitive_mode extraout_EDX_00;
  _tessellation_primitive_mode primitive_mode_00;
  _tessellation_shader_vertex_ordering vertex_ordering_00;
  _tessellation_shader_vertex_spacing extraout_EDX_01;
  _tessellation_shader_vertex_spacing extraout_EDX_02;
  _tessellation_shader_vertex_ordering vertex_ordering_01;
  _tessellation_shader_vertex_spacing extraout_EDX_03;
  _tessellation_shader_vertex_spacing vertex_spacing_00;
  _tessellation_shader_vertex_spacing vertex_spacing_01;
  long lVar4;
  char *pcVar5;
  string vertex_spacing_mode_string;
  string vertex_ordering_string;
  string primitive_mode_string;
  stringstream helper_sstream;
  stringstream result_sstream;
  string local_3c0;
  undefined1 *local_3a0;
  undefined8 local_398;
  undefined1 local_390;
  undefined7 uStack_38f;
  undefined1 *local_380;
  undefined8 local_378;
  undefined1 local_370;
  undefined7 uStack_36f;
  string local_360;
  undefined1 local_340 [128];
  ios_base local_2c0 [264];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"${VERSION}\n\n${TESSELLATION_SHADER_REQUIRE}\n",0x2b);
  if (should_pass_pointsize_data) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"${TESSELLATION_POINT_SIZE_REQUIRE}\n",0x23);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "\nlayout (TESSELLATOR_PRIMITIVE_MODE VERTEX_SPACING_MODE VERTEX_ORDERING POINT_MODE) in;\n\n"
             ,0x59);
  if (should_pass_pointsize_data) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"${IN_PER_VERTEX_DECL_POINT_SIZE}",0x20);
    lVar4 = 0x21;
    pcVar5 = "${OUT_PER_VERTEX_DECL_POINT_SIZE}";
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"${IN_PER_VERTEX_DECL}",0x15);
    lVar4 = 0x16;
    pcVar5 = "${OUT_PER_VERTEX_DECL}";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar5,lVar4);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "in OUT_TC\n{\n     vec2 value1;\n    ivec4 value2;\n} tc_data[];\n\n",0x3e);
  if (should_pass_pointsize_data) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"out      float te_pointsize;\n",0x1d);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "out       vec4 te_position;\nout       vec2 te_value1;\nout flat ivec4 te_value2;\n\nvoid main()\n{\n"
             ,0x5f);
  if (should_pass_pointsize_data) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"    te_pointsize = 0.0;\n",0x18);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "    te_position  = vec4 (0.0);\n    te_value1    = vec2 (0.0);\n    te_value2    = ivec4(0);\n\n    for (int n = 0; n < "
             ,0x74);
  poVar2 = (ostream *)
           std::ostream::operator<<((ostream *)local_1a8,this->m_gl_max_patch_vertices_value);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"; ++n)\n    {\n",0xd);
  if (should_pass_pointsize_data) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"        te_pointsize += gl_in[n].gl_PointSize;\n",0x2f);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "        te_position += gl_in  [n].gl_Position;\n        te_value1   += tc_data[n].value1;\n        te_value2   += tc_data[n].value2;\n    }\n}\n"
             ,0x8b);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_340);
  pcVar1 = local_340 + 0x10;
  primitive_mode_00 = extraout_EDX;
  if ((pointer)local_340._0_8_ != pcVar1) {
    operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
    primitive_mode_00 = extraout_EDX_00;
  }
  TessellationShaderUtils::getESTokenForPrimitiveMode_abi_cxx11_
            (&local_360,(TessellationShaderUtils *)(ulong)primitive_mode,primitive_mode_00);
  local_378 = 0;
  local_370 = 0;
  local_398 = 0;
  local_390 = 0;
  local_3a0 = &local_390;
  local_380 = &local_370;
  if (vertex_ordering == TESSELLATION_SHADER_VERTEX_ORDERING_DEFAULT) {
    TessellationShaderUtils::getESTokenForVertexOrderingMode_abi_cxx11_
              ((string *)local_340,(TessellationShaderUtils *)0x2,vertex_ordering_00);
    std::__cxx11::string::operator=((string *)&local_380,(string *)local_340);
    vertex_spacing_00 = extraout_EDX_01;
    if ((pointer)local_340._0_8_ != pcVar1) {
      operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
      vertex_spacing_00 = extraout_EDX_02;
    }
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)local_340);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_340 + 0x10),", ",2);
    TessellationShaderUtils::getESTokenForVertexOrderingMode_abi_cxx11_
              (&local_3c0,(TessellationShaderUtils *)(ulong)vertex_ordering,vertex_ordering_01);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_340 + 0x10),local_3c0._M_dataplus._M_p,local_3c0._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
      operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&local_380,(string *)&local_3c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
      operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
    std::ios_base::~ios_base(local_2c0);
    vertex_spacing_00 = extraout_EDX_03;
  }
  if (vertex_spacing == TESSELLATION_SHADER_VERTEX_SPACING_DEFAULT) {
    TessellationShaderUtils::getESTokenForVertexSpacingMode_abi_cxx11_
              ((string *)local_340,(TessellationShaderUtils *)0x3,vertex_spacing_00);
    std::__cxx11::string::operator=((string *)&local_3a0,(string *)local_340);
    if ((pointer)local_340._0_8_ != pcVar1) {
      operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
    }
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)local_340);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_340 + 0x10),", ",2);
    TessellationShaderUtils::getESTokenForVertexSpacingMode_abi_cxx11_
              (&local_3c0,(TessellationShaderUtils *)(ulong)vertex_spacing,vertex_spacing_01);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_340 + 0x10),local_3c0._M_dataplus._M_p,local_3c0._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
      operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&local_3a0,(string *)&local_3c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
      operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
    std::ios_base::~ios_base(local_2c0);
  }
  uVar3 = std::__cxx11::string::find((char *)__return_storage_ptr__,0x1b28652,0);
  while (uVar3 != 0xffffffffffffffff) {
    std::__cxx11::string::replace
              ((ulong)__return_storage_ptr__,uVar3,(char *)0x1a,(ulong)local_360._M_dataplus._M_p);
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    std::__cxx11::string::find((char *)__return_storage_ptr__,0x1b28652,0);
    uVar3 = std::__cxx11::string::find((char *)__return_storage_ptr__,0x1b28652,0);
  }
  uVar3 = std::__cxx11::string::find((char *)__return_storage_ptr__,0x1b2866d,0);
  while (uVar3 != 0xffffffffffffffff) {
    std::__cxx11::string::replace((ulong)__return_storage_ptr__,uVar3,(char *)0xf,(ulong)local_380);
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    std::__cxx11::string::find((char *)__return_storage_ptr__,0x1b2866d,0);
    uVar3 = std::__cxx11::string::find((char *)__return_storage_ptr__,0x1b2866d,0);
  }
  uVar3 = std::__cxx11::string::find((char *)__return_storage_ptr__,0x1b2733c,0);
  while (uVar3 != 0xffffffffffffffff) {
    std::__cxx11::string::replace((ulong)__return_storage_ptr__,uVar3,(char *)0x13,(ulong)local_3a0)
    ;
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    std::__cxx11::string::find((char *)__return_storage_ptr__,0x1b2733c,0);
    uVar3 = std::__cxx11::string::find((char *)__return_storage_ptr__,0x1b2733c,0);
  }
  uVar3 = std::__cxx11::string::find((char *)__return_storage_ptr__,0x1c3a769,0);
  if (uVar3 != 0xffffffffffffffff) {
    pcVar5 = "";
    if (is_point_mode_enabled) {
      pcVar5 = ", point_mode";
    }
    do {
      std::__cxx11::string::replace((ulong)__return_storage_ptr__,uVar3,(char *)0xa,(ulong)pcVar5);
      std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
      std::__cxx11::string::find((char *)__return_storage_ptr__,0x1c3a769,0);
      uVar3 = std::__cxx11::string::find((char *)__return_storage_ptr__,0x1c3a769,0);
    } while (uVar3 != 0xffffffffffffffff);
  }
  if (local_3a0 != &local_390) {
    operator_delete(local_3a0,CONCAT71(uStack_38f,local_390) + 1);
  }
  if (local_380 != &local_370) {
    operator_delete(local_380,CONCAT71(uStack_36f,local_370) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::getTessellationEvaluationShaderCode(
	bool should_pass_pointsize_data, _tessellation_primitive_mode primitive_mode,
	_tessellation_shader_vertex_ordering vertex_ordering, _tessellation_shader_vertex_spacing vertex_spacing,
	bool is_point_mode_enabled)
{
	std::stringstream result_sstream;
	std::string		  result;

	result_sstream << "${VERSION}\n"
					  "\n"
					  "${TESSELLATION_SHADER_REQUIRE}\n";

	if (should_pass_pointsize_data)
	{
		result_sstream << "${TESSELLATION_POINT_SIZE_REQUIRE}\n";
	}

	result_sstream << "\n"
					  "layout (TESSELLATOR_PRIMITIVE_MODE VERTEX_SPACING_MODE VERTEX_ORDERING POINT_MODE) in;\n"
					  "\n";
	if (should_pass_pointsize_data)
	{
		result_sstream << "${IN_PER_VERTEX_DECL_POINT_SIZE}";
		result_sstream << "${OUT_PER_VERTEX_DECL_POINT_SIZE}";
	}
	else
	{
		result_sstream << "${IN_PER_VERTEX_DECL}";
		result_sstream << "${OUT_PER_VERTEX_DECL}";
	}
	result_sstream << "in OUT_TC\n"
					  "{\n"
					  "     vec2 value1;\n"
					  "    ivec4 value2;\n"
					  "} tc_data[];\n"
					  "\n";

	if (should_pass_pointsize_data)
	{
		result_sstream << "out      float te_pointsize;\n";
	}

	result_sstream << "out       vec4 te_position;\n"
					  "out       vec2 te_value1;\n"
					  "out flat ivec4 te_value2;\n"
					  "\n"
					  "void main()\n"
					  "{\n";

	if (should_pass_pointsize_data)
	{
		result_sstream << "    te_pointsize = 0.0;\n";
	}

	result_sstream << "    te_position  = vec4 (0.0);\n"
					  "    te_value1    = vec2 (0.0);\n"
					  "    te_value2    = ivec4(0);\n"
					  "\n"
					  "    for (int n = 0; n < "
				   << m_gl_max_patch_vertices_value << "; ++n)\n"
													   "    {\n";

	if (should_pass_pointsize_data)
	{
		result_sstream << "        te_pointsize += gl_in[n].gl_PointSize;\n";
	}

	result_sstream << "        te_position += gl_in  [n].gl_Position;\n"
					  "        te_value1   += tc_data[n].value1;\n"
					  "        te_value2   += tc_data[n].value2;\n"
					  "    }\n"
					  "}\n";

	result = result_sstream.str();

	/* Replace the tokens */
	const char* point_mode_token		   = "POINT_MODE";
	std::size_t point_mode_token_index	 = std::string::npos;
	std::string primitive_mode_string	  = TessellationShaderUtils::getESTokenForPrimitiveMode(primitive_mode);
	const char* primitive_mode_token	   = "TESSELLATOR_PRIMITIVE_MODE";
	std::size_t primitive_mode_token_index = std::string::npos;
	std::string vertex_ordering_string;
	const char* vertex_ordering_token		= "VERTEX_ORDERING";
	std::size_t vertex_ordering_token_index = std::string::npos;
	std::string vertex_spacing_mode_string;
	const char* vertex_spacing_token	   = "VERTEX_SPACING_MODE";
	std::size_t vertex_spacing_token_index = std::string::npos;

	/* Prepare the vertex ordering token. We need to do this manually, because the default vertex spacing
	 * mode translates to empty string and the shader would fail to compile if we hadn't taken care of the
	 * comma
	 */
	if (vertex_ordering == TESSELLATION_SHADER_VERTEX_ORDERING_DEFAULT)
	{
		vertex_ordering_string = TessellationShaderUtils::getESTokenForVertexOrderingMode(vertex_ordering);
	}
	else
	{
		std::stringstream helper_sstream;

		helper_sstream << ", " << TessellationShaderUtils::getESTokenForVertexOrderingMode(vertex_ordering);

		vertex_ordering_string = helper_sstream.str();
	}

	/* Do the same for vertex spacing token */
	if (vertex_spacing == TESSELLATION_SHADER_VERTEX_SPACING_DEFAULT)
	{
		vertex_spacing_mode_string = TessellationShaderUtils::getESTokenForVertexSpacingMode(vertex_spacing);
	}
	else
	{
		std::stringstream helper_sstream;

		helper_sstream << ", " << TessellationShaderUtils::getESTokenForVertexSpacingMode(vertex_spacing);

		vertex_spacing_mode_string = helper_sstream.str();
	}

	/* Primitive mode */
	while ((primitive_mode_token_index = result.find(primitive_mode_token)) != std::string::npos)
	{
		result = result.replace(primitive_mode_token_index, strlen(primitive_mode_token), primitive_mode_string);

		primitive_mode_token_index = result.find(primitive_mode_token);
	}

	/* Vertex ordering */
	while ((vertex_ordering_token_index = result.find(vertex_ordering_token)) != std::string::npos)
	{
		result = result.replace(vertex_ordering_token_index, strlen(vertex_ordering_token), vertex_ordering_string);

		vertex_ordering_token_index = result.find(vertex_ordering_token);
	}

	/* Vertex spacing */
	while ((vertex_spacing_token_index = result.find(vertex_spacing_token)) != std::string::npos)
	{
		result = result.replace(vertex_spacing_token_index, strlen(vertex_spacing_token), vertex_spacing_mode_string);

		vertex_spacing_token_index = result.find(vertex_spacing_token);
	}

	/* Point mode */
	while ((point_mode_token_index = result.find(point_mode_token)) != std::string::npos)
	{
		result = result.replace(point_mode_token_index, strlen(point_mode_token),
								(is_point_mode_enabled) ? ", point_mode" : "");

		point_mode_token_index = result.find(point_mode_token);
	}

	return result;
}